

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.h
# Opt level: O0

path * __thiscall filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  long lVar1;
  allocator local_91;
  string local_90 [48];
  string local_60 [32];
  string local_40 [8];
  string s;
  size_t found;
  path *this_local;
  
  lVar1 = std::__cxx11::string::find_last_of((char)this,0x2f);
  if (lVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"",&local_91);
    path(__return_storage_ptr__,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else {
    std::__cxx11::string::string(local_40,(string *)this);
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_40);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    path(__return_storage_ptr__,(string *)local_40);
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

path parent_path() const
    {
        std::size_t found = this->path_.find_last_of(separator_);
        if (found != std::string::npos) {
            // Separator found
            std::string s(this->path_);
            s = s.substr(0, found);
            return path(s);
        }
        else {
            return path("");
        }
    }